

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  int iVar2;
  undefined *puVar3;
  long lVar4;
  QArrayData *pQVar5;
  QArrayData *pQVar6;
  undefined8 uVar7;
  XmlOutput *pXVar8;
  char *pcVar9;
  undefined4 in_register_00000034;
  storage_type *psVar10;
  QArrayData *pQVar11;
  QArrayData *pQVar12;
  QArrayData *pQVar13;
  long lVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QByteArrayView QVar74;
  QByteArrayView QVar75;
  QByteArrayView QVar76;
  QByteArrayView QVar77;
  QByteArrayView QVar78;
  QByteArrayView QVar79;
  QByteArrayView QVar80;
  QByteArrayView QVar81;
  QByteArrayView QVar82;
  QByteArrayView QVar83;
  QByteArrayView QVar84;
  QByteArrayView QVar85;
  QByteArrayView QVar86;
  QByteArrayView QVar87;
  QByteArrayView QVar88;
  QByteArrayView QVar89;
  QByteArrayView QVar90;
  QLatin1String QVar91;
  QByteArrayView QVar92;
  QByteArrayView QVar93;
  QByteArrayView QVar94;
  QByteArrayView QVar95;
  QByteArrayView QVar96;
  QByteArrayView QVar97;
  QByteArrayView QVar98;
  QByteArrayView QVar99;
  QByteArrayView QVar100;
  QByteArrayView QVar101;
  QByteArrayView QVar102;
  QByteArrayView QVar103;
  QByteArrayView QVar104;
  QByteArrayView QVar105;
  QByteArrayView QVar106;
  QByteArrayView QVar107;
  QByteArrayView QVar108;
  QByteArrayView QVar109;
  QByteArrayView QVar110;
  QByteArrayView QVar111;
  QByteArrayView QVar112;
  QByteArrayView QVar113;
  QByteArrayView QVar114;
  QByteArrayView QVar115;
  QByteArrayView QVar116;
  QByteArrayView QVar117;
  QByteArrayView QVar118;
  QByteArrayView QVar119;
  QByteArrayView QVar120;
  QByteArrayView QVar121;
  QByteArrayView QVar122;
  QByteArrayView QVar123;
  QByteArrayView QVar124;
  QByteArrayView QVar125;
  QByteArrayView QVar126;
  QByteArrayView QVar127;
  QByteArrayView QVar128;
  QLatin1String QVar129;
  QStringList result;
  QString result_1;
  QArrayData *local_1118;
  QArrayData *local_1100;
  QArrayData *local_10f8;
  QArrayData *local_10f0;
  QArrayData *local_10e8;
  QArrayData *local_10e0;
  QArrayData *local_10d8;
  QArrayData *local_10d0;
  QArrayData *local_10c8;
  QArrayData *local_10c0;
  QArrayData *local_10b8;
  QArrayData *local_10b0;
  QArrayData *local_10a8;
  xml_output local_1060;
  undefined1 local_1028 [16];
  Data *pDStack_1018;
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [8];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  undefined1 auStack_fb0 [16];
  undefined1 auStack_fa0 [16];
  undefined1 auStack_f90 [16];
  undefined1 local_f78 [8];
  undefined1 local_f70 [16];
  undefined1 local_f60 [16];
  undefined1 local_f50 [16];
  undefined1 local_f40 [8];
  undefined1 local_f38 [16];
  undefined1 local_f28 [16];
  undefined1 local_f18 [16];
  xml_output local_f08;
  undefined1 local_ed0 [8];
  undefined1 local_ec8 [16];
  undefined1 local_eb8 [16];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [8];
  undefined1 local_e90 [16];
  undefined1 local_e80 [16];
  undefined1 local_e70 [16];
  undefined1 local_e60 [8];
  undefined1 local_e58 [16];
  undefined1 local_e48 [16];
  undefined1 local_e38 [16];
  xml_output local_e28;
  undefined1 local_df0 [8];
  undefined1 local_de8 [16];
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [16];
  undefined1 local_db8 [8];
  undefined1 auStack_db0 [16];
  undefined1 auStack_da0 [16];
  undefined1 auStack_d90 [16];
  undefined1 local_d78 [8];
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [16];
  undefined1 local_d40 [8];
  undefined1 local_d38 [16];
  undefined1 local_d28 [16];
  undefined1 local_d18 [16];
  undefined1 local_d08 [8];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [8];
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [8];
  undefined1 auStack_c90 [16];
  undefined1 auStack_c80 [16];
  undefined1 auStack_c70 [16];
  undefined1 local_c60 [16];
  Data *pDStack_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  Data *pDStack_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [8];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [8];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  Data *pDStack_b70;
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  qsizetype local_b38;
  xml_output local_b28;
  undefined1 local_af0 [8];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  Data *pDStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  Data *pDStack_a70;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [8];
  undefined1 auStack_a40 [16];
  undefined1 auStack_a30 [16];
  undefined1 auStack_a20 [16];
  undefined1 local_a08 [8];
  undefined1 auStack_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined1 auStack_9e0 [16];
  undefined1 local_9d0 [8];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [8];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  Data *pDStack_918;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  Data *pDStack_8e0;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  Data *pDStack_8a8;
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [8];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [8];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [8];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [8];
  undefined1 auStack_7d0 [16];
  undefined1 auStack_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_798 [8];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [8];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  xml_output local_6f0;
  xml_output local_6b8;
  undefined1 local_680 [8];
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [8];
  undefined1 auStack_640 [16];
  undefined1 auStack_630 [16];
  undefined1 auStack_620 [16];
  undefined1 local_610 [8];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [8];
  undefined1 auStack_5d0 [16];
  undefined1 auStack_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [8];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [8];
  undefined1 auStack_560 [16];
  undefined1 auStack_550 [16];
  undefined1 auStack_540 [16];
  undefined1 local_530 [16];
  Data *pDStack_520;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [8];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  undefined1 auStack_480 [16];
  undefined1 auStack_470 [16];
  undefined1 auStack_460 [16];
  xml_output local_448;
  undefined1 local_410 [8];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  undefined1 auStack_3d0 [16];
  undefined1 auStack_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined1 local_398 [8];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  undefined1 auStack_320 [16];
  undefined1 auStack_310 [16];
  undefined1 auStack_300 [16];
  undefined1 local_2e8 [8];
  undefined1 auStack_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined1 auStack_2c0 [16];
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 auStack_280 [16];
  undefined1 local_270 [8];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  Data *pDStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [8];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  undefined1 auStack_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [16];
  undefined1 local_188 [8];
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 local_150 [16];
  Data *pDStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  undefined1 local_70 [48];
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)local_70;
  QString::fromUtf8(QVar16);
  local_70._24_8_ = local_70._16_8_;
  pQVar6 = (QArrayData *)CONCAT44(local_70._4_4_,local_70._0_4_);
  local_70._0_4_ = tTag;
  local_70._16_8_ = local_70._8_8_;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70._32_16_ = (undefined1  [16])0x0;
  local_40 = 0;
  local_70._8_8_ = pQVar6;
  pXVar8 = XmlOutput::operator<<
                     ((XmlOutput *)CONCAT44(in_register_00000034,__fd),(xml_output *)local_70);
  attrTagX(&local_a8,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a8);
  attrTagX(&local_e0,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e0);
  attrTagX(&local_118,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_118);
  if (*(long *)((long)__buf + 0x60) == 0) {
    local_150._0_4_ = tNothing;
    stack0xfffffffffffffeb8 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
  }
  else {
    QVar17.m_data = (storage_type *)0x18;
    QVar17.m_size = (qsizetype)local_150;
    QString::fromUtf8(QVar17);
    pQVar11 = (QArrayData *)CONCAT44(local_150._4_4_,local_150._0_4_);
    local_138._0_8_ = pDStack_140;
    local_150._0_4_ = tTagValue;
    pDStack_140 = (Data *)local_150._8_8_;
    local_150._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_138._8_8_ = *(undefined8 *)((long)__buf + 0x50);
    local_128 = *(undefined1 (*) [16])((long)__buf + 0x58);
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar11,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_150);
  switch(*(undefined4 *)((long)__buf + 0x68)) {
  case 1:
    psVar10 = &DAT_0000000c;
    break;
  case 2:
    psVar10 = (storage_type *)0x3;
    break;
  case 3:
    psVar10 = (storage_type *)0x16;
    break;
  case 4:
    psVar10 = (storage_type *)0x15;
    break;
  default:
    pQVar11 = (QArrayData *)0x0;
    goto LAB_001f0586;
  }
  QVar18.m_data = psVar10;
  QVar18.m_size = (qsizetype)local_188;
  QString::fromUtf8(QVar18);
  auStack_160 = auStack_180;
  pQVar11 = (QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if ((char16_t *)auStack_180._8_8_ == (char16_t *)0x0) {
LAB_001f0586:
    local_188._0_4_ = tNothing;
    auStack_180 = (undefined1  [16])0x0;
    auStack_170 = (undefined1  [16])0x0;
    auStack_160 = (undefined1  [16])0x0;
  }
  else {
    QVar19.m_data = (storage_type *)0xf;
    QVar19.m_size = (qsizetype)local_188;
    QString::fromUtf8(QVar19);
    pQVar13 = (QArrayData *)CONCAT44(local_188._4_4_,local_188._0_4_);
    auStack_170._0_8_ = auStack_180._8_8_;
    local_188._0_4_ = tTagValue;
    auStack_180._8_8_ = auStack_180._0_8_;
    auStack_180._0_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_170._8_8_ = pQVar11;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_188);
  switch(*(undefined4 *)((long)__buf + 0x6c)) {
  case 0:
    psVar10 = (storage_type *)0x0;
    break;
  case 1:
    psVar10 = (storage_type *)0x16;
    break;
  case 2:
    psVar10 = (storage_type *)0x1c;
    break;
  case 3:
    psVar10 = (storage_type *)0x10;
    break;
  default:
    pQVar13 = (QArrayData *)0x0;
    goto LAB_001f06dc;
  }
  QVar20.m_size = local_1c8;
  QVar20.m_data = psVar10;
  QString::fromUtf8(QVar20);
  auStack_1a0 = auStack_1c0;
  pQVar13 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
  if ((char16_t *)auStack_1c0._8_8_ == (char16_t *)0x0) {
LAB_001f06dc:
    local_1c8._0_4_ = tNothing;
    auStack_1c0 = (undefined1  [16])0x0;
    auStack_1b0 = (undefined1  [16])0x0;
    auStack_1a0 = (undefined1  [16])0x0;
  }
  else {
    QVar21.m_data = (storage_type *)0x12;
    QVar21.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar21);
    pQVar12 = (QArrayData *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_);
    auStack_1b0._0_8_ = auStack_1c0._8_8_;
    local_1c8._0_4_ = tTagValue;
    auStack_1c0._8_8_ = auStack_1c0._0_8_;
    auStack_1c0._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_1b0._8_8_ = pQVar13;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_1c8);
  if ((ulong)*(uint *)((long)__buf + 0x70) < 3) {
    puVar3 = (&PTR_anon_var_dwarf_413b71_002e2af8)[*(uint *)((long)__buf + 0x70)];
    QVar22.m_data = (storage_type *)0x11;
    QVar22.m_size = (qsizetype)local_200;
    QString::fromUtf8(QVar22);
    pQVar12 = (QArrayData *)CONCAT44(local_200._4_4_,local_200._0_4_);
    uVar7 = local_1f8._0_8_;
    local_1e8._0_8_ = local_1f8._8_8_;
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar9 = psVar10 + (long)(puVar3 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar9 != '\0');
    QVar23.m_data = psVar10;
    QVar23.m_size = (qsizetype)local_200;
    QString::fromUtf8(QVar23);
    local_1d8 = local_1f8;
    local_1e8._8_8_ = CONCAT44(local_200._4_4_,local_200._0_4_);
    local_200._0_4_ = tTagValue;
    local_1f8._8_8_ = uVar7;
    local_1f8._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_1e8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1e8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1e8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_1e8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1e8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_1e8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_1e8._8_8_,2,0x10);
      }
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  else {
    local_200._0_4_ = tNothing;
    local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_200);
  if (*(long *)((long)__buf + 0x88) == 0) {
    local_238._0_4_ = tNothing;
    stack0xfffffffffffffdd0 = (undefined1  [16])0x0;
    local_220 = (undefined1  [16])0x0;
    local_210 = (undefined1  [16])0x0;
  }
  else {
    QVar24.m_data = (storage_type *)0x15;
    QVar24.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar24);
    pQVar12 = (QArrayData *)CONCAT44(local_238._4_4_,local_238._0_4_);
    local_220._0_8_ = pDStack_228;
    local_238._0_4_ = tTagValue;
    pDStack_228 = (Data *)local_238._8_8_;
    local_238._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_220._8_8_ = *(undefined8 *)((long)__buf + 0x78);
    local_210 = *(undefined1 (*) [16])((long)__buf + 0x80);
    if ((int *)local_220._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_220._8_8_ = *(int *)local_220._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_238);
  iVar2 = *(int *)((long)__buf + 0x90);
  if (iVar2 == -1) {
    local_270._0_4_ = tNothing;
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_248 = (undefined1  [16])0x0;
  }
  else {
    QVar25.m_data = (storage_type *)0x13;
    QVar25.m_size = (qsizetype)local_270;
    QString::fromUtf8(QVar25);
    pQVar12 = (QArrayData *)CONCAT44(local_270._4_4_,local_270._0_4_);
    uVar7 = local_268._0_8_;
    local_258._0_8_ = local_268._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar26.m_data = psVar10;
    QVar26.m_size = (qsizetype)local_270;
    QString::fromUtf8(QVar26);
    local_248 = local_268;
    local_258._8_8_ = CONCAT44(local_270._4_4_,local_270._0_4_);
    local_270._0_4_ = tTagValue;
    local_268._8_8_ = uVar7;
    local_268._0_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_258._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_258._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_258._8_8_,2,0x10);
      }
    }
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar12,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_270);
  iVar2 = *(int *)((long)__buf + 0x94);
  if (iVar2 == 2) {
    psVar10 = (storage_type *)0x7;
LAB_001f0ab0:
    QVar27.m_data = psVar10;
    QVar27.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar27);
    auStack_280 = auStack_2a0;
    pQVar12 = (QArrayData *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    if ((char16_t *)auStack_2a0._8_8_ == (char16_t *)0x0) goto LAB_001f0b50;
    QVar28.m_data = (storage_type *)0x11;
    QVar28.m_size = (qsizetype)local_2a8;
    QString::fromUtf8(QVar28);
    pQVar5 = (QArrayData *)CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
    auStack_290._0_8_ = auStack_2a0._8_8_;
    local_2a8._0_4_ = tTagValue;
    auStack_2a0._8_8_ = auStack_2a0._0_8_;
    auStack_2a0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_290._8_8_ = pQVar12;
    if (pQVar12 != (QArrayData *)0x0) {
      LOCK();
      (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar10 = &DAT_00000008;
      goto LAB_001f0ab0;
    }
    if (iVar2 == 0) {
      psVar10 = (storage_type *)0x5;
      goto LAB_001f0ab0;
    }
    pQVar12 = (QArrayData *)0x0;
LAB_001f0b50:
    local_2a8._0_4_ = tNothing;
    auStack_2a0 = (undefined1  [16])0x0;
    auStack_290 = (undefined1  [16])0x0;
    auStack_280 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_2a8);
  if (*(int *)((long)__buf + 0x98) == 2) {
    psVar10 = &DAT_0000000c;
LAB_001f0bcc:
    QVar29.m_data = psVar10;
    QVar29.m_size = (qsizetype)local_2e8;
    QString::fromUtf8(QVar29);
    auStack_2c0 = auStack_2e0;
    local_10f0 = (QArrayData *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
    if ((char16_t *)auStack_2e0._8_8_ == (char16_t *)0x0) goto LAB_001f0c76;
    QVar30.m_data = (storage_type *)0x9;
    QVar30.m_size = (qsizetype)local_2e8;
    QString::fromUtf8(QVar30);
    pQVar5 = (QArrayData *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
    auStack_2d0._0_8_ = auStack_2e0._8_8_;
    local_2e8._0_4_ = tTagValue;
    auStack_2e0._8_8_ = auStack_2e0._0_8_;
    auStack_2e0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_2d0._8_8_ = local_10f0;
    if (local_10f0 != (QArrayData *)0x0) {
      LOCK();
      (local_10f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (*(int *)((long)__buf + 0x98) == 1) {
      psVar10 = (storage_type *)0xa;
      goto LAB_001f0bcc;
    }
    local_10f0 = (QArrayData *)0x0;
LAB_001f0c76:
    local_2e8._0_4_ = tNothing;
    auStack_2e0 = (undefined1  [16])0x0;
    auStack_2d0 = (undefined1  [16])0x0;
    auStack_2c0 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_2e8);
  iVar2 = *(int *)((long)__buf + 0x9c);
  if (iVar2 == 4) {
    psVar10 = (storage_type *)0x9;
LAB_001f0d08:
    QVar31.m_data = psVar10;
    QVar31.m_size = (qsizetype)local_328;
    QString::fromUtf8(QVar31);
    auStack_300 = auStack_320;
    local_10c0 = (QArrayData *)CONCAT44(local_328._4_4_,local_328._0_4_);
    if ((char16_t *)auStack_320._8_8_ == (char16_t *)0x0) goto LAB_001f0db2;
    QVar32.m_data = (storage_type *)0x10;
    QVar32.m_size = (qsizetype)local_328;
    QString::fromUtf8(QVar32);
    pQVar5 = (QArrayData *)CONCAT44(local_328._4_4_,local_328._0_4_);
    auStack_310._0_8_ = auStack_320._8_8_;
    local_328._0_4_ = tTagValue;
    auStack_320._8_8_ = auStack_320._0_8_;
    auStack_320._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_310._8_8_ = local_10c0;
    if (local_10c0 != (QArrayData *)0x0) {
      LOCK();
      (local_10c0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10c0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if ((iVar2 == 2) || (iVar2 == 1)) {
      psVar10 = (storage_type *)0x4;
      goto LAB_001f0d08;
    }
    local_10c0 = (QArrayData *)0x0;
LAB_001f0db2:
    local_328._0_4_ = tNothing;
    auStack_320 = (undefined1  [16])0x0;
    auStack_310 = (undefined1  [16])0x0;
    auStack_300 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_328);
  iVar2 = *(int *)((long)__buf + 0xa0);
  if (iVar2 == -1) {
    local_360._0_4_ = tNothing;
    local_358 = (undefined1  [16])0x0;
    local_348 = (undefined1  [16])0x0;
    local_338 = (undefined1  [16])0x0;
  }
  else {
    QVar33.m_data = (storage_type *)0xe;
    QVar33.m_size = (qsizetype)local_360;
    QString::fromUtf8(QVar33);
    pQVar5 = (QArrayData *)CONCAT44(local_360._4_4_,local_360._0_4_);
    uVar7 = local_358._0_8_;
    local_348._0_8_ = local_358._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar34.m_data = psVar10;
    QVar34.m_size = (qsizetype)local_360;
    QString::fromUtf8(QVar34);
    local_338 = local_358;
    local_348._8_8_ = CONCAT44(local_360._4_4_,local_360._0_4_);
    local_360._0_4_ = tTagValue;
    local_358._8_8_ = uVar7;
    local_358._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_348._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_348._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_348._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_348._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_348._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_348._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_348._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_360);
  iVar2 = *(int *)((long)__buf + 0x2f8);
  if (iVar2 == -1) {
    local_398._0_4_ = tNothing;
    local_390 = (undefined1  [16])0x0;
    local_380 = (undefined1  [16])0x0;
    local_370 = (undefined1  [16])0x0;
  }
  else {
    QVar35.m_data = (storage_type *)0x17;
    QVar35.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar35);
    pQVar5 = (QArrayData *)CONCAT44(local_398._4_4_,local_398._0_4_);
    uVar7 = local_390._0_8_;
    local_380._0_8_ = local_390._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar36.m_data = psVar10;
    QVar36.m_size = (qsizetype)local_398;
    QString::fromUtf8(QVar36);
    local_370 = local_390;
    local_380._8_8_ = CONCAT44(local_398._4_4_,local_398._0_4_);
    local_398._0_4_ = tTagValue;
    local_390._8_8_ = uVar7;
    local_390._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_380._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_380._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_380._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_380._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_380._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_380._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_380._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_398);
  local_10e8 = (QArrayData *)0x0;
  switch(*(undefined4 *)((long)__buf + 0xa8)) {
  case 0:
    if (0xa0 < *(int *)(*(long *)((long)__buf + 0x318) + 4)) {
      psVar10 = (storage_type *)0x4;
      goto LAB_001f10b3;
    }
    local_10e8 = (QArrayData *)0x0;
  default:
switchD_001f1062_caseD_2:
    local_3d8._0_4_ = tNothing;
    auStack_3d0 = (undefined1  [16])0x0;
    auStack_3c0 = (undefined1  [16])0x0;
    auStack_3b0 = (undefined1  [16])0x0;
    break;
  case 1:
    psVar10 = &DAT_00000008;
    goto LAB_001f10b3;
  case 3:
    goto LAB_001f10a6;
  case 4:
LAB_001f10a6:
    psVar10 = (storage_type *)0xf;
LAB_001f10b3:
    QVar37.m_data = psVar10;
    QVar37.m_size = (qsizetype)local_3d8;
    QString::fromUtf8(QVar37);
    auStack_3b0 = auStack_3d0;
    local_10e8 = (QArrayData *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_);
    if ((char16_t *)auStack_3d0._8_8_ == (char16_t *)0x0) goto switchD_001f1062_caseD_2;
    QVar38.m_data = (storage_type *)0x16;
    QVar38.m_size = (qsizetype)local_3d8;
    QString::fromUtf8(QVar38);
    pQVar5 = (QArrayData *)CONCAT44(local_3d8._4_4_,local_3d8._0_4_);
    auStack_3c0._0_8_ = auStack_3d0._8_8_;
    local_3d8._0_4_ = tTagValue;
    auStack_3d0._8_8_ = auStack_3d0._0_8_;
    auStack_3d0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_3c0._8_8_ = local_10e8;
    if (local_10e8 != (QArrayData *)0x0) {
      LOCK();
      (local_10e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10e8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_3d8);
  iVar2 = *(int *)((long)__buf + 0xb4);
  if (iVar2 == -1) {
    local_410._0_4_ = tNothing;
    local_408 = (undefined1  [16])0x0;
    local_3f8 = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
  }
  else {
    QVar39.m_data = (storage_type *)0x19;
    QVar39.m_size = (qsizetype)local_410;
    QString::fromUtf8(QVar39);
    pQVar5 = (QArrayData *)CONCAT44(local_410._4_4_,local_410._0_4_);
    uVar7 = local_408._0_8_;
    local_3f8._0_8_ = local_408._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar40.m_data = psVar10;
    QVar40.m_size = (qsizetype)local_410;
    QString::fromUtf8(QVar40);
    local_3e8 = local_408;
    local_3f8._8_8_ = CONCAT44(local_410._4_4_,local_410._0_4_);
    local_410._0_4_ = tTagValue;
    local_408._8_8_ = uVar7;
    local_408._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_3f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_3f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_3f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_3f8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_410);
  attrTagX(&local_448,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_448);
  if (*(int *)((long)__buf + 0xd0) == 2) {
    psVar10 = (storage_type *)0x18;
LAB_001f1335:
    QVar41.m_data = psVar10;
    QVar41.m_size = (qsizetype)local_488;
    QString::fromUtf8(QVar41);
    auStack_460 = auStack_480;
    local_10f8 = (QArrayData *)CONCAT44(local_488._4_4_,local_488._0_4_);
    if ((char16_t *)auStack_480._8_8_ == (char16_t *)0x0) goto LAB_001f13df;
    QVar42.m_data = (storage_type *)0x1c;
    QVar42.m_size = (qsizetype)local_488;
    QString::fromUtf8(QVar42);
    pQVar5 = (QArrayData *)CONCAT44(local_488._4_4_,local_488._0_4_);
    auStack_470._0_8_ = auStack_480._8_8_;
    local_488._0_4_ = tTagValue;
    auStack_480._8_8_ = auStack_480._0_8_;
    auStack_480._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_470._8_8_ = local_10f8;
    if (local_10f8 != (QArrayData *)0x0) {
      LOCK();
      (local_10f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (*(int *)((long)__buf + 0xd0) == 1) {
      psVar10 = (storage_type *)0x17;
      goto LAB_001f1335;
    }
    local_10f8 = (QArrayData *)0x0;
LAB_001f13df:
    local_488._0_4_ = tNothing;
    auStack_480 = (undefined1  [16])0x0;
    auStack_470 = (undefined1  [16])0x0;
    auStack_460 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_488);
  iVar2 = *(int *)((long)__buf + 0xd4);
  if (iVar2 == -1) {
    local_4c0._0_4_ = tNothing;
    local_4b8 = (undefined1  [16])0x0;
    local_4a8 = (undefined1  [16])0x0;
    local_498 = (undefined1  [16])0x0;
  }
  else {
    QVar43.m_data = (storage_type *)0x1c;
    QVar43.m_size = (qsizetype)local_4c0;
    QString::fromUtf8(QVar43);
    pQVar5 = (QArrayData *)CONCAT44(local_4c0._4_4_,local_4c0._0_4_);
    uVar7 = local_4b8._0_8_;
    local_4a8._0_8_ = local_4b8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar44.m_data = psVar10;
    QVar44.m_size = (qsizetype)local_4c0;
    QString::fromUtf8(QVar44);
    local_498 = local_4b8;
    local_4a8._8_8_ = CONCAT44(local_4c0._4_4_,local_4c0._0_4_);
    local_4c0._0_4_ = tTagValue;
    local_4b8._8_8_ = uVar7;
    local_4b8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_4a8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4a8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_4a8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4a8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_4a8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_4c0);
  iVar2 = *(int *)((long)__buf + 0x29c);
  if (iVar2 == -1) {
    local_4f8._0_4_ = tNothing;
    local_4f0 = (undefined1  [16])0x0;
    local_4e0 = (undefined1  [16])0x0;
    local_4d0 = (undefined1  [16])0x0;
  }
  else {
    QVar45.m_data = (storage_type *)0xd;
    QVar45.m_size = (qsizetype)local_4f8;
    QString::fromUtf8(QVar45);
    pQVar5 = (QArrayData *)CONCAT44(local_4f8._4_4_,local_4f8._0_4_);
    uVar7 = local_4f0._0_8_;
    local_4e0._0_8_ = local_4f0._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar46.m_data = psVar10;
    QVar46.m_size = (qsizetype)local_4f8;
    QString::fromUtf8(QVar46);
    local_4d0 = local_4f0;
    local_4e0._8_8_ = CONCAT44(local_4f8._4_4_,local_4f8._0_4_);
    local_4f8._0_4_ = tTagValue;
    local_4f0._8_8_ = uVar7;
    local_4f0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_4e0._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_4e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_4e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_4e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_4e0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_4e0._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_4f8);
  if (*(long *)((long)__buf + 0x2f0) == 0) {
    local_530._0_4_ = tNothing;
    stack0xfffffffffffffad8 = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
  }
  else {
    QVar47.m_data = (storage_type *)0xe;
    QVar47.m_size = (qsizetype)local_530;
    QString::fromUtf8(QVar47);
    pQVar5 = (QArrayData *)CONCAT44(local_530._4_4_,local_530._0_4_);
    local_518._0_8_ = pDStack_520;
    local_530._0_4_ = tTagValue;
    pDStack_520 = (Data *)local_530._8_8_;
    local_530._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_518._8_8_ = *(undefined8 *)((long)__buf + 0x2e0);
    local_508 = *(undefined1 (*) [16])((long)__buf + 0x2e8);
    if ((int *)local_518._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_518._8_8_ = *(int *)local_518._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_530);
  iVar2 = *(int *)((long)__buf + 0xe0);
  if (iVar2 == 2) {
LAB_001f1786:
    psVar10 = (storage_type *)0x5;
LAB_001f1793:
    QVar48.m_data = psVar10;
    QVar48.m_size = (qsizetype)local_568;
    QString::fromUtf8(QVar48);
    auStack_540 = auStack_560;
    local_10c8 = (QArrayData *)CONCAT44(local_568._4_4_,local_568._0_4_);
    if ((char16_t *)auStack_560._8_8_ == (char16_t *)0x0) goto LAB_001f183d;
    QVar49.m_data = (storage_type *)0x11;
    QVar49.m_size = (qsizetype)local_568;
    QString::fromUtf8(QVar49);
    pQVar5 = (QArrayData *)CONCAT44(local_568._4_4_,local_568._0_4_);
    auStack_550._0_8_ = auStack_560._8_8_;
    local_568._0_4_ = tTagValue;
    auStack_560._8_8_ = auStack_560._0_8_;
    auStack_560._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_550._8_8_ = local_10c8;
    if (local_10c8 != (QArrayData *)0x0) {
      LOCK();
      (local_10c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10c8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar10 = (storage_type *)0x4;
      goto LAB_001f1793;
    }
    if (iVar2 == 0) goto LAB_001f1786;
    local_10c8 = (QArrayData *)0x0;
LAB_001f183d:
    local_568._0_4_ = tNothing;
    auStack_560 = (undefined1  [16])0x0;
    auStack_550 = (undefined1  [16])0x0;
    auStack_540 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_568);
  iVar2 = *(int *)((long)__buf + 0xe4);
  if (iVar2 == -1) {
    local_5a0._0_4_ = tNothing;
    local_598 = (undefined1  [16])0x0;
    local_588 = (undefined1  [16])0x0;
    local_578 = (undefined1  [16])0x0;
  }
  else {
    QVar50.m_data = (storage_type *)0x16;
    QVar50.m_size = (qsizetype)local_5a0;
    QString::fromUtf8(QVar50);
    pQVar5 = (QArrayData *)CONCAT44(local_5a0._4_4_,local_5a0._0_4_);
    uVar7 = local_598._0_8_;
    local_588._0_8_ = local_598._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar51.m_data = psVar10;
    QVar51.m_size = (qsizetype)local_5a0;
    QString::fromUtf8(QVar51);
    local_578 = local_598;
    local_588._8_8_ = CONCAT44(local_5a0._4_4_,local_5a0._0_4_);
    local_5a0._0_4_ = tTagValue;
    local_598._8_8_ = uVar7;
    local_598._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_588._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_588._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_588._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_588._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_588._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_588._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_588._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_5a0);
  if (*(int *)((long)__buf + 0xe8) == 1) {
    psVar10 = (storage_type *)0x5;
LAB_001f19e2:
    QVar52.m_data = psVar10;
    QVar52.m_size = (qsizetype)local_5d8;
    QString::fromUtf8(QVar52);
    auStack_5b0 = auStack_5d0;
    local_1100 = (QArrayData *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_);
    if ((char16_t *)auStack_5d0._8_8_ == (char16_t *)0x0) goto LAB_001f1a8c;
    QVar53.m_data = (storage_type *)0x10;
    QVar53.m_size = (qsizetype)local_5d8;
    QString::fromUtf8(QVar53);
    pQVar5 = (QArrayData *)CONCAT44(local_5d8._4_4_,local_5d8._0_4_);
    auStack_5c0._0_8_ = auStack_5d0._8_8_;
    local_5d8._0_4_ = tTagValue;
    auStack_5d0._8_8_ = auStack_5d0._0_8_;
    auStack_5d0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_5c0._8_8_ = local_1100;
    if (local_1100 != (QArrayData *)0x0) {
      LOCK();
      (local_1100->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1100->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (*(int *)((long)__buf + 0xe8) == 2) {
      psVar10 = (storage_type *)0x4;
      goto LAB_001f19e2;
    }
    local_1100 = (QArrayData *)0x0;
LAB_001f1a8c:
    local_5d8._0_4_ = tNothing;
    auStack_5d0 = (undefined1  [16])0x0;
    auStack_5c0 = (undefined1  [16])0x0;
    auStack_5b0 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_5d8);
  iVar2 = *(int *)((long)__buf + 0xf0);
  if (iVar2 == -1) {
    local_610._0_4_ = tNothing;
    local_608 = (undefined1  [16])0x0;
    local_5f8 = (undefined1  [16])0x0;
    local_5e8 = (undefined1  [16])0x0;
  }
  else {
    QVar54.m_data = (storage_type *)0x17;
    QVar54.m_size = (qsizetype)local_610;
    QString::fromUtf8(QVar54);
    pQVar5 = (QArrayData *)CONCAT44(local_610._4_4_,local_610._0_4_);
    uVar7 = local_608._0_8_;
    local_5f8._0_8_ = local_608._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar55.m_data = psVar10;
    QVar55.m_size = (qsizetype)local_610;
    QString::fromUtf8(QVar55);
    local_5e8 = local_608;
    local_5f8._8_8_ = CONCAT44(local_610._4_4_,local_610._0_4_);
    local_610._0_4_ = tTagValue;
    local_608._8_8_ = uVar7;
    local_608._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_5f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_5f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_5f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_5f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_5f8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_610);
  iVar2 = *(int *)((long)__buf + 0xec);
  if (iVar2 == 0) {
    psVar10 = (storage_type *)0x7;
LAB_001f1c4b:
    QVar56.m_data = psVar10;
    QVar56.m_size = (qsizetype)local_648;
    QString::fromUtf8(QVar56);
    auStack_620 = auStack_640;
    local_10d0 = (QArrayData *)CONCAT44(local_648._4_4_,local_648._0_4_);
    if ((char16_t *)auStack_640._8_8_ == (char16_t *)0x0) goto LAB_001f1cf5;
    QVar57.m_data = (storage_type *)0x12;
    QVar57.m_size = (qsizetype)local_648;
    QString::fromUtf8(QVar57);
    pQVar5 = (QArrayData *)CONCAT44(local_648._4_4_,local_648._0_4_);
    auStack_630._0_8_ = auStack_640._8_8_;
    local_648._0_4_ = tTagValue;
    auStack_640._8_8_ = auStack_640._0_8_;
    auStack_640._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_630._8_8_ = local_10d0;
    if (local_10d0 != (QArrayData *)0x0) {
      LOCK();
      (local_10d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar10 = (storage_type *)0x6;
      goto LAB_001f1c4b;
    }
    if (iVar2 == 2) {
      psVar10 = (storage_type *)0x4;
      goto LAB_001f1c4b;
    }
    local_10d0 = (QArrayData *)0x0;
LAB_001f1cf5:
    local_648._0_4_ = tNothing;
    auStack_640 = (undefined1  [16])0x0;
    auStack_630 = (undefined1  [16])0x0;
    auStack_620 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_648);
  iVar2 = *(int *)((long)__buf + 0xf4);
  if (iVar2 == -1) {
    local_680._0_4_ = tNothing;
    local_678 = (undefined1  [16])0x0;
    local_668 = (undefined1  [16])0x0;
    local_658 = (undefined1  [16])0x0;
  }
  else {
    QVar58.m_data = (storage_type *)0x1e;
    QVar58.m_size = (qsizetype)local_680;
    QString::fromUtf8(QVar58);
    pQVar5 = (QArrayData *)CONCAT44(local_680._4_4_,local_680._0_4_);
    uVar7 = local_678._0_8_;
    local_668._0_8_ = local_678._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar59.m_data = psVar10;
    QVar59.m_size = (qsizetype)local_680;
    QString::fromUtf8(QVar59);
    local_658 = local_678;
    local_668._8_8_ = CONCAT44(local_680._4_4_,local_680._0_4_);
    local_680._0_4_ = tTagValue;
    local_678._8_8_ = uVar7;
    local_678._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_668._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_668._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_668._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_668._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_668._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_668._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_668._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_680);
  attrTagX(&local_6b8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_6b8);
  attrTagX(&local_6f0,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_6f0);
  iVar2 = *(int *)((long)__buf + 0xd8);
  if (iVar2 == -1) {
    local_728._0_4_ = tNothing;
    local_720 = (undefined1  [16])0x0;
    local_710 = (undefined1  [16])0x0;
    local_700 = (undefined1  [16])0x0;
  }
  else {
    QVar60.m_data = (storage_type *)0x14;
    QVar60.m_size = (qsizetype)local_728;
    QString::fromUtf8(QVar60);
    pQVar5 = (QArrayData *)CONCAT44(local_728._4_4_,local_728._0_4_);
    uVar7 = local_720._0_8_;
    local_710._0_8_ = local_720._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar61.m_data = psVar10;
    QVar61.m_size = (qsizetype)local_728;
    QString::fromUtf8(QVar61);
    local_700 = local_720;
    local_710._8_8_ = CONCAT44(local_728._4_4_,local_728._0_4_);
    local_728._0_4_ = tTagValue;
    local_720._8_8_ = uVar7;
    local_720._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_710._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_710._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_710._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_710._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_710._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_710._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_710._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_728);
  iVar2 = *(int *)((long)__buf + 0x2c0);
  if (iVar2 == -1) {
    local_760._0_4_ = tNothing;
    local_758 = (undefined1  [16])0x0;
    local_748 = (undefined1  [16])0x0;
    local_738 = (undefined1  [16])0x0;
  }
  else {
    QVar62.m_data = (storage_type *)0x1d;
    QVar62.m_size = (qsizetype)local_760;
    QString::fromUtf8(QVar62);
    pQVar5 = (QArrayData *)CONCAT44(local_760._4_4_,local_760._0_4_);
    uVar7 = local_758._0_8_;
    local_748._0_8_ = local_758._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar63.m_data = psVar10;
    QVar63.m_size = (qsizetype)local_760;
    QString::fromUtf8(QVar63);
    local_738 = local_758;
    local_748._8_8_ = CONCAT44(local_760._4_4_,local_760._0_4_);
    local_760._0_4_ = tTagValue;
    local_758._8_8_ = uVar7;
    local_758._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_748._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_748._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_748._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_748._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_748._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_748._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_748._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_760);
  iVar2 = *(int *)((long)__buf + 0x134);
  if (iVar2 == -1) {
    local_798._0_4_ = tNothing;
    local_790 = (undefined1  [16])0x0;
    local_780 = (undefined1  [16])0x0;
    local_770 = (undefined1  [16])0x0;
  }
  else {
    QVar64.m_data = (storage_type *)0x19;
    QVar64.m_size = (qsizetype)local_798;
    QString::fromUtf8(QVar64);
    pQVar5 = (QArrayData *)CONCAT44(local_798._4_4_,local_798._0_4_);
    uVar7 = local_790._0_8_;
    local_780._0_8_ = local_790._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar65.m_data = psVar10;
    QVar65.m_size = (qsizetype)local_798;
    QString::fromUtf8(QVar65);
    local_770 = local_790;
    local_780._8_8_ = CONCAT44(local_798._4_4_,local_798._0_4_);
    local_798._0_4_ = tTagValue;
    local_790._8_8_ = uVar7;
    local_790._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_780._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_780._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_780._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_780._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_780._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_780._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_780._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_798);
  iVar2 = *(int *)((long)__buf + 0x13c);
  if (iVar2 == 2) {
    psVar10 = (storage_type *)0xb;
LAB_001f2294:
    QVar66.m_data = psVar10;
    QVar66.m_size = (qsizetype)local_7d8;
    QString::fromUtf8(QVar66);
    auStack_7b0 = auStack_7d0;
    local_10d8 = (QArrayData *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_);
    if ((char16_t *)auStack_7d0._8_8_ == (char16_t *)0x0) goto LAB_001f233e;
    QVar67.m_data = (storage_type *)0x17;
    QVar67.m_size = (qsizetype)local_7d8;
    QString::fromUtf8(QVar67);
    pQVar5 = (QArrayData *)CONCAT44(local_7d8._4_4_,local_7d8._0_4_);
    auStack_7c0._0_8_ = auStack_7d0._8_8_;
    local_7d8._0_4_ = tTagValue;
    auStack_7d0._8_8_ = auStack_7d0._0_8_;
    auStack_7d0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_7c0._8_8_ = local_10d8;
    if (local_10d8 != (QArrayData *)0x0) {
      LOCK();
      (local_10d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10d8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar10 = (storage_type *)0x12;
      goto LAB_001f2294;
    }
    if (iVar2 == 0) {
      psVar10 = &DAT_00000008;
      goto LAB_001f2294;
    }
    local_10d8 = (QArrayData *)0x0;
LAB_001f233e:
    local_7d8._0_4_ = tNothing;
    auStack_7d0 = (undefined1  [16])0x0;
    auStack_7c0 = (undefined1  [16])0x0;
    auStack_7b0 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_7d8);
  iVar2 = *(int *)((long)__buf + 0xdc);
  if (iVar2 == -1) {
    local_810._0_4_ = tNothing;
    local_808 = (undefined1  [16])0x0;
    local_7f8 = (undefined1  [16])0x0;
    local_7e8 = (undefined1  [16])0x0;
  }
  else {
    QVar68.m_data = (storage_type *)0x12;
    QVar68.m_size = (qsizetype)local_810;
    QString::fromUtf8(QVar68);
    pQVar5 = (QArrayData *)CONCAT44(local_810._4_4_,local_810._0_4_);
    uVar7 = local_808._0_8_;
    local_7f8._0_8_ = local_808._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar69.m_data = psVar10;
    QVar69.m_size = (qsizetype)local_810;
    QString::fromUtf8(QVar69);
    local_7e8 = local_808;
    local_7f8._8_8_ = CONCAT44(local_810._4_4_,local_810._0_4_);
    local_810._0_4_ = tTagValue;
    local_808._8_8_ = uVar7;
    local_808._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_7f8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_7f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_7f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_7f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_7f8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_7f8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_810);
  iVar2 = *(int *)((long)__buf + 0x178);
  if (iVar2 == -1) {
    local_848._0_4_ = tNothing;
    local_840 = (undefined1  [16])0x0;
    local_830 = (undefined1  [16])0x0;
    local_820 = (undefined1  [16])0x0;
  }
  else {
    QVar70.m_data = (storage_type *)0xe;
    QVar70.m_size = (qsizetype)local_848;
    QString::fromUtf8(QVar70);
    pQVar5 = (QArrayData *)CONCAT44(local_848._4_4_,local_848._0_4_);
    uVar7 = local_840._0_8_;
    local_830._0_8_ = local_840._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar71.m_data = psVar10;
    QVar71.m_size = (qsizetype)local_848;
    QString::fromUtf8(QVar71);
    local_820 = local_840;
    local_830._8_8_ = CONCAT44(local_848._4_4_,local_848._0_4_);
    local_848._0_4_ = tTagValue;
    local_840._8_8_ = uVar7;
    local_840._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_830._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_830._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_830._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_830._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_830._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_830._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_830._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_848);
  iVar2 = *(int *)((long)__buf + 0x2a4);
  if (iVar2 == -1) {
    local_880._0_4_ = tNothing;
    local_878 = (undefined1  [16])0x0;
    local_868 = (undefined1  [16])0x0;
    local_858 = (undefined1  [16])0x0;
  }
  else {
    QVar72.m_data = (storage_type *)0x19;
    QVar72.m_size = (qsizetype)local_880;
    QString::fromUtf8(QVar72);
    pQVar5 = (QArrayData *)CONCAT44(local_880._4_4_,local_880._0_4_);
    uVar7 = local_878._0_8_;
    local_868._0_8_ = local_878._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar73.m_data = psVar10;
    QVar73.m_size = (qsizetype)local_880;
    QString::fromUtf8(QVar73);
    local_858 = local_878;
    local_868._8_8_ = CONCAT44(local_880._4_4_,local_880._0_4_);
    local_880._0_4_ = tTagValue;
    local_878._8_8_ = uVar7;
    local_878._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_868._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_868._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_868._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_868._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_868._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_868._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_868._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_880);
  if (*(long *)((long)__buf + 0x158) == 0) {
    local_8b8._0_4_ = tNothing;
    stack0xfffffffffffff750 = (undefined1  [16])0x0;
    local_8a0 = (undefined1  [16])0x0;
    local_890 = (undefined1  [16])0x0;
  }
  else {
    QVar74.m_data = (storage_type *)0x10;
    QVar74.m_size = (qsizetype)local_8b8;
    QString::fromUtf8(QVar74);
    pQVar5 = (QArrayData *)CONCAT44(local_8b8._4_4_,local_8b8._0_4_);
    local_8a0._0_8_ = pDStack_8a8;
    local_8b8._0_4_ = tTagValue;
    pDStack_8a8 = (Data *)local_8b8._8_8_;
    local_8b8._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8a0._8_8_ = *(undefined8 *)((long)__buf + 0x148);
    local_890 = *(undefined1 (*) [16])((long)__buf + 0x150);
    if ((int *)local_8a0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_8a0._8_8_ = *(int *)local_8a0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_8b8);
  if (*(long *)((long)__buf + 0x170) == 0) {
    local_8f0._0_4_ = tNothing;
    stack0xfffffffffffff718 = (undefined1  [16])0x0;
    local_8d8 = (undefined1  [16])0x0;
    local_8c8 = (undefined1  [16])0x0;
  }
  else {
    QVar75.m_data = (storage_type *)0x12;
    QVar75.m_size = (qsizetype)local_8f0;
    QString::fromUtf8(QVar75);
    pQVar5 = (QArrayData *)CONCAT44(local_8f0._4_4_,local_8f0._0_4_);
    local_8d8._0_8_ = pDStack_8e0;
    local_8f0._0_4_ = tTagValue;
    pDStack_8e0 = (Data *)local_8f0._8_8_;
    local_8f0._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8d8._8_8_ = *(undefined8 *)((long)__buf + 0x160);
    local_8c8 = *(undefined1 (*) [16])((long)__buf + 0x168);
    if ((int *)local_8d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_8d8._8_8_ = *(int *)local_8d8._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_8f0);
  if (*(long *)((long)__buf + 400) == 0) {
    local_928._0_4_ = tNothing;
    stack0xfffffffffffff6e0 = (undefined1  [16])0x0;
    local_910 = (undefined1  [16])0x0;
    local_900 = (undefined1  [16])0x0;
  }
  else {
    QVar76.m_data = (storage_type *)0xe;
    QVar76.m_size = (qsizetype)local_928;
    QString::fromUtf8(QVar76);
    pQVar5 = (QArrayData *)CONCAT44(local_928._4_4_,local_928._0_4_);
    local_910._0_8_ = pDStack_918;
    local_928._0_4_ = tTagValue;
    pDStack_918 = (Data *)local_928._8_8_;
    local_928._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_910._8_8_ = *(undefined8 *)((long)__buf + 0x180);
    local_900 = *(undefined1 (*) [16])((long)__buf + 0x188);
    if ((int *)local_910._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_910._8_8_ = *(int *)local_910._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_928);
  iVar2 = *(int *)((long)__buf + 0x198);
  if (iVar2 == -1) {
    local_960._0_4_ = tNothing;
    local_958 = (undefined1  [16])0x0;
    local_948 = (undefined1  [16])0x0;
    local_938 = (undefined1  [16])0x0;
  }
  else {
    QVar77.m_data = (storage_type *)0x12;
    QVar77.m_size = (qsizetype)local_960;
    QString::fromUtf8(QVar77);
    pQVar5 = (QArrayData *)CONCAT44(local_960._4_4_,local_960._0_4_);
    uVar7 = local_958._0_8_;
    local_948._0_8_ = local_958._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar78.m_data = psVar10;
    QVar78.m_size = (qsizetype)local_960;
    QString::fromUtf8(QVar78);
    local_938 = local_958;
    local_948._8_8_ = CONCAT44(local_960._4_4_,local_960._0_4_);
    local_960._0_4_ = tTagValue;
    local_958._8_8_ = uVar7;
    local_958._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_948._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_948._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_948._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_948._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_948._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_948._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_948._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_960);
  iVar2 = *(int *)((long)__buf + 0x19c);
  if (iVar2 == -1) {
    local_998._0_4_ = tNothing;
    local_990 = (undefined1  [16])0x0;
    local_980 = (undefined1  [16])0x0;
    local_970 = (undefined1  [16])0x0;
  }
  else {
    QVar79.m_data = (storage_type *)0x11;
    QVar79.m_size = (qsizetype)local_998;
    QString::fromUtf8(QVar79);
    pQVar5 = (QArrayData *)CONCAT44(local_998._4_4_,local_998._0_4_);
    uVar7 = local_990._0_8_;
    local_980._0_8_ = local_990._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar80.m_data = psVar10;
    QVar80.m_size = (qsizetype)local_998;
    QString::fromUtf8(QVar80);
    local_970 = local_990;
    local_980._8_8_ = CONCAT44(local_998._4_4_,local_998._0_4_);
    local_998._0_4_ = tTagValue;
    local_990._8_8_ = uVar7;
    local_990._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_980._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_980._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_980._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_980._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_980._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_980._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_980._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_998);
  iVar2 = *(int *)((long)__buf + 0x1a0);
  if (iVar2 == -1) {
    local_9d0._0_4_ = tNothing;
    local_9c8 = (undefined1  [16])0x0;
    local_9b8 = (undefined1  [16])0x0;
    local_9a8 = (undefined1  [16])0x0;
  }
  else {
    QVar81.m_data = (storage_type *)0xd;
    QVar81.m_size = (qsizetype)local_9d0;
    QString::fromUtf8(QVar81);
    pQVar5 = (QArrayData *)CONCAT44(local_9d0._4_4_,local_9d0._0_4_);
    uVar7 = local_9c8._0_8_;
    local_9b8._0_8_ = local_9c8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar82.m_data = psVar10;
    QVar82.m_size = (qsizetype)local_9d0;
    QString::fromUtf8(QVar82);
    local_9a8 = local_9c8;
    local_9b8._8_8_ = CONCAT44(local_9d0._4_4_,local_9d0._0_4_);
    local_9d0._0_4_ = tTagValue;
    local_9c8._8_8_ = uVar7;
    local_9c8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_9b8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_9b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_9b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_9b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_9b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_9b8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_9b8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_9d0);
  switch(*(undefined4 *)((long)__buf + 0x1a4)) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    psVar10 = (storage_type *)0x4;
    goto LAB_001f2d5a;
  default:
    local_10b0 = (QArrayData *)0x0;
    goto LAB_001f2e04;
  }
  psVar10 = &DAT_00000008;
LAB_001f2d5a:
  QVar83.m_data = psVar10;
  QVar83.m_size = (qsizetype)local_a08;
  QString::fromUtf8(QVar83);
  auStack_9e0 = auStack_a00;
  local_10b0 = (QArrayData *)CONCAT44(local_a08._4_4_,local_a08._0_4_);
  if ((char16_t *)auStack_a00._8_8_ == (char16_t *)0x0) {
LAB_001f2e04:
    local_a08._0_4_ = tNothing;
    auStack_a00 = (undefined1  [16])0x0;
    auStack_9f0 = (undefined1  [16])0x0;
    auStack_9e0 = (undefined1  [16])0x0;
  }
  else {
    QVar84.m_data = &DAT_0000000c;
    QVar84.m_size = (qsizetype)local_a08;
    QString::fromUtf8(QVar84);
    pQVar5 = (QArrayData *)CONCAT44(local_a08._4_4_,local_a08._0_4_);
    auStack_9f0._0_8_ = auStack_a00._8_8_;
    local_a08._0_4_ = tTagValue;
    auStack_a00._8_8_ = auStack_a00._0_8_;
    auStack_a00._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_9f0._8_8_ = local_10b0;
    if (local_10b0 != (QArrayData *)0x0) {
      LOCK();
      (local_10b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10b0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_a08);
  iVar2 = *(int *)((long)__buf + 0x268);
  if (iVar2 == 3) {
    psVar10 = (storage_type *)0x3;
LAB_001f2e9a:
    QVar85.m_data = psVar10;
    QVar85.m_size = (qsizetype)local_a48;
    QString::fromUtf8(QVar85);
    auStack_a20 = auStack_a40;
    local_10e0 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48._0_4_);
    if ((char16_t *)auStack_a40._8_8_ == (char16_t *)0x0) goto LAB_001f2f40;
    QVar86.m_data = (storage_type *)0x11;
    QVar86.m_size = (qsizetype)local_a48;
    QString::fromUtf8(QVar86);
    pQVar5 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48._0_4_);
    auStack_a30._0_8_ = auStack_a40._8_8_;
    local_a48._0_4_ = tTagValue;
    auStack_a40._8_8_ = auStack_a40._0_8_;
    auStack_a40._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_a30._8_8_ = local_10e0;
    if (local_10e0 != (QArrayData *)0x0) {
      LOCK();
      (local_10e0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10e0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    if (iVar2 == 1) {
      psVar10 = (storage_type *)0x6;
      goto LAB_001f2e9a;
    }
    if (iVar2 == 0) {
      psVar10 = &DAT_00000008;
      goto LAB_001f2e9a;
    }
    local_10e0 = (QArrayData *)0x0;
LAB_001f2f40:
    local_a48._0_4_ = tNothing;
    auStack_a40 = (undefined1  [16])0x0;
    auStack_a30 = (undefined1  [16])0x0;
    auStack_a20 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_a48);
  if (*(long *)((long)__buf + 0x1f0) == 0) {
    local_a80._0_4_ = tNothing;
    stack0xfffffffffffff588 = (undefined1  [16])0x0;
    local_a68 = (undefined1  [16])0x0;
    local_a58 = (undefined1  [16])0x0;
  }
  else {
    QVar87.m_data = (storage_type *)0x15;
    QVar87.m_size = (qsizetype)local_a80;
    QString::fromUtf8(QVar87);
    pQVar5 = (QArrayData *)CONCAT44(local_a80._4_4_,local_a80._0_4_);
    local_a68._0_8_ = pDStack_a70;
    local_a80._0_4_ = tTagValue;
    pDStack_a70 = (Data *)local_a80._8_8_;
    local_a80._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a68._8_8_ = *(undefined8 *)((long)__buf + 0x1e0);
    local_a58 = *(undefined1 (*) [16])((long)__buf + 0x1e8);
    if ((int *)local_a68._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_a68._8_8_ = *(int *)local_a68._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_a80);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_ab8._0_4_ = tNothing;
    stack0xfffffffffffff550 = (undefined1  [16])0x0;
    local_aa0 = (undefined1  [16])0x0;
    local_a90 = (undefined1  [16])0x0;
  }
  else {
    QVar88.m_data = (storage_type *)0x1b;
    QVar88.m_size = (qsizetype)local_ab8;
    QString::fromUtf8(QVar88);
    pQVar5 = (QArrayData *)CONCAT44(local_ab8._4_4_,local_ab8._0_4_);
    local_aa0._0_8_ = pDStack_aa8;
    local_ab8._0_4_ = tTagValue;
    pDStack_aa8 = (Data *)local_ab8._8_8_;
    local_ab8._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_aa0._8_8_ = *(undefined8 *)((long)__buf + 0x1c8);
    local_a90 = *(undefined1 (*) [16])((long)__buf + 0x1d0);
    if ((int *)local_aa0._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_aa0._8_8_ = *(int *)local_aa0._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_ab8);
  iVar2 = *(int *)((long)__buf + 0x140);
  if (iVar2 == -1) {
    local_af0._0_4_ = tNothing;
    local_ae8 = (undefined1  [16])0x0;
    local_ad8 = (undefined1  [16])0x0;
    local_ac8 = (undefined1  [16])0x0;
  }
  else {
    QVar89.m_data = (storage_type *)0x16;
    QVar89.m_size = (qsizetype)local_af0;
    QString::fromUtf8(QVar89);
    pQVar5 = (QArrayData *)CONCAT44(local_af0._4_4_,local_af0._0_4_);
    uVar7 = local_ae8._0_8_;
    local_ad8._0_8_ = local_ae8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar90.m_data = psVar10;
    QVar90.m_size = (qsizetype)local_af0;
    QString::fromUtf8(QVar90);
    local_ac8 = local_ae8;
    local_ad8._8_8_ = CONCAT44(local_af0._4_4_,local_af0._0_4_);
    local_af0._0_4_ = tTagValue;
    local_ae8._8_8_ = uVar7;
    local_ae8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_ad8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_ad8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ad8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_ad8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ad8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_ad8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_ad8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_af0);
  local_b48 = (undefined1  [16])0x0;
  local_b38 = 0;
  QList<QString>::reserve((QList<QString> *)local_b48,*(qsizetype *)((long)__buf + 0x208));
  if (*(long *)((long)__buf + 0x208) != 0) {
    lVar14 = 0x10;
    uVar15 = 0;
    do {
      lVar4 = *(long *)((long)__buf + 0x200);
      local_b28._0_8_ = *(long *)(lVar4 + -0x10 + lVar14);
      local_b28.xo_text.d.d = *(Data **)(lVar4 + -8 + lVar14);
      local_b28.xo_text.d.ptr = *(char16_t **)(lVar4 + lVar14);
      if ((QArrayData *)local_b28._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_b28._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_b28._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar91.m_data = (char *)0x2;
      QVar91.m_size = (qsizetype)&local_b28;
      QVar129.m_data = (char *)0x1;
      QVar129.m_size = (qsizetype)"\\\"";
      QString::replace(QVar91,QVar129,0x2b5765);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)local_b48,local_b38,(QString *)&local_b28);
      QList<QString>::end((QList<QString> *)local_b48);
      if ((QArrayData *)local_b28._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b28._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b28._0_8_,2,0x10);
        }
      }
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar15 < *(ulong *)((long)__buf + 0x208));
  }
  attrTagX(&local_b28,"PreprocessorDefinitions",(QStringList *)local_b48,";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_b28);
  if (*(long *)((long)__buf + 0x310) == 0) {
    local_b80._0_4_ = tNothing;
    stack0xfffffffffffff488 = (undefined1  [16])0x0;
    local_b68 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
  }
  else {
    QVar92.m_data = (storage_type *)0x14;
    QVar92.m_size = (qsizetype)local_b80;
    QString::fromUtf8(QVar92);
    pQVar5 = (QArrayData *)CONCAT44(local_b80._4_4_,local_b80._0_4_);
    local_b68._0_8_ = pDStack_b70;
    local_b80._0_4_ = tTagValue;
    pDStack_b70 = (Data *)local_b80._8_8_;
    local_b80._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b68._8_8_ = *(undefined8 *)((long)__buf + 0x300);
    local_b58 = *(undefined1 (*) [16])((long)__buf + 0x308);
    if ((int *)local_b68._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_b68._8_8_ = *(int *)local_b68._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_b80);
  iVar2 = *(int *)((long)__buf + 300);
  if (iVar2 == -1) {
    local_bb8._0_4_ = tNothing;
    local_bb0 = (undefined1  [16])0x0;
    local_ba0 = (undefined1  [16])0x0;
    local_b90 = (undefined1  [16])0x0;
  }
  else {
    QVar93.m_data = (storage_type *)0x1d;
    QVar93.m_size = (qsizetype)local_bb8;
    QString::fromUtf8(QVar93);
    pQVar5 = (QArrayData *)CONCAT44(local_bb8._4_4_,local_bb8._0_4_);
    uVar7 = local_bb0._0_8_;
    local_ba0._0_8_ = local_bb0._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar94.m_data = psVar10;
    QVar94.m_size = (qsizetype)local_bb8;
    QString::fromUtf8(QVar94);
    local_b90 = local_bb0;
    local_ba0._8_8_ = CONCAT44(local_bb8._4_4_,local_bb8._0_4_);
    local_bb8._0_4_ = tTagValue;
    local_bb0._8_8_ = uVar7;
    local_bb0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_ba0._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_ba0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ba0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_ba0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_ba0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_ba0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_ba0._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_bb8);
  if ((ulong)*(uint *)((long)__buf + 0x128) < 3) {
    puVar3 = (&PTR_anon_var_dwarf_413b71_002e2af8)[*(uint *)((long)__buf + 0x128)];
    QVar95.m_data = (storage_type *)0x10;
    QVar95.m_size = (qsizetype)local_bf0;
    QString::fromUtf8(QVar95);
    pQVar5 = (QArrayData *)CONCAT44(local_bf0._4_4_,local_bf0._0_4_);
    uVar7 = local_be8._0_8_;
    local_bd8._0_8_ = local_be8._8_8_;
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar9 = psVar10 + (long)(puVar3 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar9 != '\0');
    QVar96.m_data = psVar10;
    QVar96.m_size = (qsizetype)local_bf0;
    QString::fromUtf8(QVar96);
    local_bc8 = local_be8;
    local_bd8._8_8_ = CONCAT44(local_bf0._4_4_,local_bf0._0_4_);
    local_bf0._0_4_ = tTagValue;
    local_be8._8_8_ = uVar7;
    local_be8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_bd8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_bd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_bd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_bd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_bd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_bd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_bd8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  else {
    local_bf0._0_4_ = tNothing;
    local_be8 = (undefined1  [16])0x0;
    local_bd8 = (undefined1  [16])0x0;
    local_bc8 = (undefined1  [16])0x0;
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_bf0);
  if (((*(int *)(*(long *)((long)__buf + 0x318) + 4) < 0xb0) || (*(int *)((long)__buf + 0xa8) != 0))
     && (*(long *)((long)__buf + 0x220) == 0)) {
    local_c28._0_4_ = tNothing;
    stack0xfffffffffffff3e0 = (undefined1  [16])0x0;
    local_c10 = (undefined1  [16])0x0;
    local_c00 = (undefined1  [16])0x0;
  }
  else {
    QVar97.m_data = (storage_type *)0x17;
    QVar97.m_size = (qsizetype)local_c28;
    QString::fromUtf8(QVar97);
    pQVar5 = (QArrayData *)CONCAT44(local_c28._4_4_,local_c28._0_4_);
    local_c10._0_8_ = pDStack_c18;
    local_c28._0_4_ = tTagValue;
    pDStack_c18 = (Data *)local_c28._8_8_;
    local_c28._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c10._8_8_ = *(undefined8 *)((long)__buf + 0x210);
    local_c00 = *(undefined1 (*) [16])((long)__buf + 0x218);
    if ((int *)local_c10._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c10._8_8_ = *(int *)local_c10._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_c28);
  if (*(long *)((long)__buf + 0x2b8) == 0) {
    local_c60._0_4_ = tNothing;
    stack0xfffffffffffff3a8 = (undefined1  [16])0x0;
    local_c48 = (undefined1  [16])0x0;
    local_c38 = (undefined1  [16])0x0;
  }
  else {
    QVar98.m_data = (storage_type *)0xf;
    QVar98.m_size = (qsizetype)local_c60;
    QString::fromUtf8(QVar98);
    pQVar5 = (QArrayData *)CONCAT44(local_c60._4_4_,local_c60._0_4_);
    local_c48._0_8_ = pDStack_c50;
    local_c60._0_4_ = tTagValue;
    pDStack_c50 = (Data *)local_c60._8_8_;
    local_c60._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c48._8_8_ = *(undefined8 *)((long)__buf + 0x2a8);
    local_c38 = *(undefined1 (*) [16])((long)__buf + 0x2b0);
    if ((int *)local_c48._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c48._8_8_ = *(int *)local_c48._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_c60);
  switch(*(undefined4 *)((long)__buf + 0x228)) {
  case 0:
    psVar10 = (storage_type *)0xd;
    break;
  case 1:
    psVar10 = (storage_type *)0x12;
    break;
  case 2:
    psVar10 = (storage_type *)0x10;
    break;
  case 3:
    psVar10 = (storage_type *)0x15;
    break;
  default:
    local_10b8 = (QArrayData *)0x0;
    goto LAB_001f39b2;
  }
  QVar99.m_data = psVar10;
  QVar99.m_size = (qsizetype)local_c98;
  QString::fromUtf8(QVar99);
  auStack_c70 = auStack_c90;
  local_10b8 = (QArrayData *)CONCAT44(local_c98._4_4_,local_c98._0_4_);
  if ((char16_t *)auStack_c90._8_8_ == (char16_t *)0x0) {
LAB_001f39b2:
    local_c98._0_4_ = tNothing;
    auStack_c90 = (undefined1  [16])0x0;
    auStack_c80 = (undefined1  [16])0x0;
    auStack_c70 = (undefined1  [16])0x0;
  }
  else {
    QVar100.m_data = (storage_type *)0xe;
    QVar100.m_size = (qsizetype)local_c98;
    QString::fromUtf8(QVar100);
    pQVar5 = (QArrayData *)CONCAT44(local_c98._4_4_,local_c98._0_4_);
    auStack_c80._0_8_ = auStack_c90._8_8_;
    local_c98._0_4_ = tTagValue;
    auStack_c90._8_8_ = auStack_c90._0_8_;
    auStack_c90._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_c80._8_8_ = local_10b8;
    if (local_10b8 != (QArrayData *)0x0) {
      LOCK();
      (local_10b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10b8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_c98);
  iVar2 = *(int *)((long)__buf + 0x22c);
  if (iVar2 == -1) {
    local_cd0._0_4_ = tNothing;
    local_cc8 = (undefined1  [16])0x0;
    local_cb8 = (undefined1  [16])0x0;
    local_ca8 = (undefined1  [16])0x0;
  }
  else {
    QVar101.m_data = (storage_type *)0xf;
    QVar101.m_size = (qsizetype)local_cd0;
    QString::fromUtf8(QVar101);
    pQVar5 = (QArrayData *)CONCAT44(local_cd0._4_4_,local_cd0._0_4_);
    uVar7 = local_cc8._0_8_;
    local_cb8._0_8_ = local_cc8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar102.m_data = psVar10;
    QVar102.m_size = (qsizetype)local_cd0;
    QString::fromUtf8(QVar102);
    local_ca8 = local_cc8;
    local_cb8._8_8_ = CONCAT44(local_cd0._4_4_,local_cd0._0_4_);
    local_cd0._0_4_ = tTagValue;
    local_cc8._8_8_ = uVar7;
    local_cc8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_cb8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_cb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_cb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_cb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_cb8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_cd0);
  iVar2 = *(int *)((long)__buf + 0x230);
  if (iVar2 == -1) {
    local_d08._0_4_ = tNothing;
    local_d00 = (undefined1  [16])0x0;
    local_cf0 = (undefined1  [16])0x0;
    local_ce0 = (undefined1  [16])0x0;
  }
  else {
    QVar103.m_data = &DAT_0000000c;
    QVar103.m_size = (qsizetype)local_d08;
    QString::fromUtf8(QVar103);
    pQVar5 = (QArrayData *)CONCAT44(local_d08._4_4_,local_d08._0_4_);
    uVar7 = local_d00._0_8_;
    local_cf0._0_8_ = local_d00._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar104.m_data = psVar10;
    QVar104.m_size = (qsizetype)local_d08;
    QString::fromUtf8(QVar104);
    local_ce0 = local_d00;
    local_cf0._8_8_ = CONCAT44(local_d08._4_4_,local_d08._0_4_);
    local_d08._0_4_ = tTagValue;
    local_d00._8_8_ = uVar7;
    local_d00._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_cf0._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_cf0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cf0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_cf0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_cf0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_cf0._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_cf0._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_d08);
  iVar2 = *(int *)((long)__buf + 0x234);
  if (iVar2 == -1) {
    local_d40._0_4_ = tNothing;
    local_d38 = (undefined1  [16])0x0;
    local_d28 = (undefined1  [16])0x0;
    local_d18 = (undefined1  [16])0x0;
  }
  else {
    QVar105.m_data = (storage_type *)0x10;
    QVar105.m_size = (qsizetype)local_d40;
    QString::fromUtf8(QVar105);
    pQVar5 = (QArrayData *)CONCAT44(local_d40._4_4_,local_d40._0_4_);
    uVar7 = local_d38._0_8_;
    local_d28._0_8_ = local_d38._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar106.m_data = psVar10;
    QVar106.m_size = (qsizetype)local_d40;
    QString::fromUtf8(QVar106);
    local_d18 = local_d38;
    local_d28._8_8_ = CONCAT44(local_d40._4_4_,local_d40._0_4_);
    local_d40._0_4_ = tTagValue;
    local_d38._8_8_ = uVar7;
    local_d38._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_d28._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_d28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_d28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d28._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_d40);
  iVar2 = *(int *)((long)__buf + 0x238);
  if (iVar2 == -1) {
    local_d78._0_4_ = tNothing;
    local_d70 = (undefined1  [16])0x0;
    local_d60 = (undefined1  [16])0x0;
    local_d50 = (undefined1  [16])0x0;
  }
  else {
    QVar107.m_data = (storage_type *)0xd;
    QVar107.m_size = (qsizetype)local_d78;
    QString::fromUtf8(QVar107);
    pQVar5 = (QArrayData *)CONCAT44(local_d78._4_4_,local_d78._0_4_);
    uVar7 = local_d70._0_8_;
    local_d60._0_8_ = local_d70._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar108.m_data = psVar10;
    QVar108.m_size = (qsizetype)local_d78;
    QString::fromUtf8(QVar108);
    local_d50 = local_d70;
    local_d60._8_8_ = CONCAT44(local_d78._4_4_,local_d78._0_4_);
    local_d78._0_4_ = tTagValue;
    local_d70._8_8_ = uVar7;
    local_d70._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_d60._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_d60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_d60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d60._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_d78);
  switch(*(undefined4 *)((long)__buf + 0x23c)) {
  case 1:
    psVar10 = (storage_type *)0x5;
    goto LAB_001f3f0c;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    psVar10 = (storage_type *)0x7;
    goto LAB_001f3f0c;
  default:
    local_1118 = (QArrayData *)0x0;
    goto LAB_001f3fb8;
  }
  psVar10 = (storage_type *)0x6;
LAB_001f3f0c:
  QVar109.m_data = psVar10;
  QVar109.m_size = (qsizetype)local_db8;
  QString::fromUtf8(QVar109);
  auStack_d90 = auStack_db0;
  local_1118 = (QArrayData *)CONCAT44(local_db8._4_4_,local_db8._0_4_);
  if ((char16_t *)auStack_db0._8_8_ == (char16_t *)0x0) {
LAB_001f3fb8:
    local_db8._0_4_ = tNothing;
    auStack_db0 = (undefined1  [16])0x0;
    auStack_da0 = (undefined1  [16])0x0;
    auStack_d90 = (undefined1  [16])0x0;
  }
  else {
    QVar110.m_data = (storage_type *)0x15;
    QVar110.m_size = (qsizetype)local_db8;
    QString::fromUtf8(QVar110);
    pQVar5 = (QArrayData *)CONCAT44(local_db8._4_4_,local_db8._0_4_);
    auStack_da0._0_8_ = auStack_db0._8_8_;
    local_db8._0_4_ = tTagValue;
    auStack_db0._8_8_ = auStack_db0._0_8_;
    auStack_db0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_da0._8_8_ = local_1118;
    if (local_1118 != (QArrayData *)0x0) {
      LOCK();
      (local_1118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1118->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_db8);
  iVar2 = *(int *)((long)__buf + 0x240);
  if (iVar2 == -1) {
    local_df0._0_4_ = tNothing;
    local_de8 = (undefined1  [16])0x0;
    local_dd8 = (undefined1  [16])0x0;
    local_dc8 = (undefined1  [16])0x0;
  }
  else {
    QVar111.m_data = (storage_type *)0x15;
    QVar111.m_size = (qsizetype)local_df0;
    QString::fromUtf8(QVar111);
    pQVar5 = (QArrayData *)CONCAT44(local_df0._4_4_,local_df0._0_4_);
    uVar7 = local_de8._0_8_;
    local_dd8._0_8_ = local_de8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar112.m_data = psVar10;
    QVar112.m_size = (qsizetype)local_df0;
    QString::fromUtf8(QVar112);
    local_dc8 = local_de8;
    local_dd8._8_8_ = CONCAT44(local_df0._4_4_,local_df0._0_4_);
    local_df0._0_4_ = tTagValue;
    local_de8._8_8_ = uVar7;
    local_de8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_dd8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_dd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_dd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_dd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_dd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_dd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_dd8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_df0);
  attrTagX(&local_e28,"TreatSpecificWarningsAsErrors",(QStringList *)((long)__buf + 0x270),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e28);
  iVar2 = *(int *)((long)__buf + 0x288);
  if (iVar2 == -1) {
    local_e60._0_4_ = tNothing;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
  }
  else {
    QVar113.m_data = (storage_type *)0x13;
    QVar113.m_size = (qsizetype)local_e60;
    QString::fromUtf8(QVar113);
    pQVar5 = (QArrayData *)CONCAT44(local_e60._4_4_,local_e60._0_4_);
    uVar7 = local_e58._0_8_;
    local_e48._0_8_ = local_e58._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar114.m_data = psVar10;
    QVar114.m_size = (qsizetype)local_e60;
    QString::fromUtf8(QVar114);
    local_e38 = local_e58;
    local_e48._8_8_ = CONCAT44(local_e60._4_4_,local_e60._0_4_);
    local_e60._0_4_ = tTagValue;
    local_e58._8_8_ = uVar7;
    local_e58._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_e48._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e48._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e48._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_e48._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e48._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_e48._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e48._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_e60);
  iVar2 = *(int *)((long)__buf + 0x244);
  if (iVar2 == -1) {
    local_e98._0_4_ = tNothing;
    local_e90 = (undefined1  [16])0x0;
    local_e80 = (undefined1  [16])0x0;
    local_e70 = (undefined1  [16])0x0;
  }
  else {
    QVar115.m_data = (storage_type *)0x19;
    QVar115.m_size = (qsizetype)local_e98;
    QString::fromUtf8(QVar115);
    pQVar5 = (QArrayData *)CONCAT44(local_e98._4_4_,local_e98._0_4_);
    uVar7 = local_e90._0_8_;
    local_e80._0_8_ = local_e90._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar116.m_data = psVar10;
    QVar116.m_size = (qsizetype)local_e98;
    QString::fromUtf8(QVar116);
    local_e70 = local_e90;
    local_e80._8_8_ = CONCAT44(local_e98._4_4_,local_e98._0_4_);
    local_e98._0_4_ = tTagValue;
    local_e90._8_8_ = uVar7;
    local_e90._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_e80._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_e80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_e80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_e80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_e80._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e80._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_e98);
  iVar2 = *(int *)((long)__buf + 0x24c);
  if (iVar2 == -1) {
    local_ed0._0_4_ = tNothing;
    local_ec8 = (undefined1  [16])0x0;
    local_eb8 = (undefined1  [16])0x0;
    local_ea8 = (undefined1  [16])0x0;
  }
  else {
    QVar117.m_data = (storage_type *)0x22;
    QVar117.m_size = (qsizetype)local_ed0;
    QString::fromUtf8(QVar117);
    pQVar5 = (QArrayData *)CONCAT44(local_ed0._4_4_,local_ed0._0_4_);
    uVar7 = local_ec8._0_8_;
    local_eb8._0_8_ = local_ec8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar118.m_data = psVar10;
    QVar118.m_size = (qsizetype)local_ed0;
    QString::fromUtf8(QVar118);
    local_ea8 = local_ec8;
    local_eb8._8_8_ = CONCAT44(local_ed0._4_4_,local_ed0._0_4_);
    local_ed0._0_4_ = tTagValue;
    local_ec8._8_8_ = uVar7;
    local_ec8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_eb8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_eb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_eb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_eb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_eb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_eb8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_eb8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_ed0);
  attrTagX(&local_f08,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),";");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_f08);
  iVar2 = *(int *)((long)__buf + 0x2a0);
  if (iVar2 == -1) {
    local_f40._0_4_ = tNothing;
    local_f38 = (undefined1  [16])0x0;
    local_f28 = (undefined1  [16])0x0;
    local_f18 = (undefined1  [16])0x0;
  }
  else {
    QVar119.m_data = &DAT_0000000c;
    QVar119.m_size = (qsizetype)local_f40;
    QString::fromUtf8(QVar119);
    pQVar5 = (QArrayData *)CONCAT44(local_f40._4_4_,local_f40._0_4_);
    uVar7 = local_f38._0_8_;
    local_f28._0_8_ = local_f38._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar120.m_data = psVar10;
    QVar120.m_size = (qsizetype)local_f40;
    QString::fromUtf8(QVar120);
    local_f18 = local_f38;
    local_f28._8_8_ = CONCAT44(local_f40._4_4_,local_f40._0_4_);
    local_f40._0_4_ = tTagValue;
    local_f38._8_8_ = uVar7;
    local_f38._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_f28._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_f28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_f28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_f28._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f28._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_f40);
  iVar2 = *(int *)((long)__buf + 0x26c);
  if (iVar2 == -1) {
    local_f78._0_4_ = tNothing;
    local_f70 = (undefined1  [16])0x0;
    local_f60 = (undefined1  [16])0x0;
    local_f50 = (undefined1  [16])0x0;
  }
  else {
    QVar121.m_data = (storage_type *)0x1d;
    QVar121.m_size = (qsizetype)local_f78;
    QString::fromUtf8(QVar121);
    pQVar5 = (QArrayData *)CONCAT44(local_f78._4_4_,local_f78._0_4_);
    uVar7 = local_f70._0_8_;
    local_f60._0_8_ = local_f70._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar122.m_data = psVar10;
    QVar122.m_size = (qsizetype)local_f78;
    QString::fromUtf8(QVar122);
    local_f50 = local_f70;
    local_f60._8_8_ = CONCAT44(local_f78._4_4_,local_f78._0_4_);
    local_f78._0_4_ = tTagValue;
    local_f70._8_8_ = uVar7;
    local_f70._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_f60._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_f60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_f60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_f60._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f60._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_f78);
  switch(*(undefined4 *)((long)__buf + 0x28c)) {
  case 0:
    psVar10 = (storage_type *)0x12;
    goto LAB_001f47be;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    break;
  default:
    local_10a8 = (QArrayData *)0x0;
    goto LAB_001f4873;
  }
  psVar10 = (storage_type *)0x6;
LAB_001f47be:
  QVar123.m_data = psVar10;
  QVar123.m_size = (qsizetype)local_fb8;
  QString::fromUtf8(QVar123);
  auStack_f90 = auStack_fb0;
  local_10a8 = (QArrayData *)CONCAT44(local_fb8._4_4_,local_fb8._0_4_);
  if ((char16_t *)auStack_fb0._8_8_ == (char16_t *)0x0) {
LAB_001f4873:
    local_fb8._0_4_ = tNothing;
    auStack_fb0 = (undefined1  [16])0x0;
    auStack_fa0 = (undefined1  [16])0x0;
    auStack_f90 = (undefined1  [16])0x0;
  }
  else {
    QVar124.m_data = &DAT_0000000c;
    QVar124.m_size = (qsizetype)local_fb8;
    QString::fromUtf8(QVar124);
    pQVar5 = (QArrayData *)CONCAT44(local_fb8._4_4_,local_fb8._0_4_);
    auStack_fa0._0_8_ = auStack_fb0._8_8_;
    local_fb8._0_4_ = tTagValue;
    auStack_fb0._8_8_ = auStack_fb0._0_8_;
    auStack_fb0._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    auStack_fa0._8_8_ = local_10a8;
    if (local_10a8 != (QArrayData *)0x0) {
      LOCK();
      (local_10a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_10a8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_fb8);
  iVar2 = *(int *)((long)__buf + 0x290);
  if (iVar2 == -1) {
    local_ff0._0_4_ = tNothing;
    local_fe8 = (undefined1  [16])0x0;
    local_fd8 = (undefined1  [16])0x0;
    local_fc8 = (undefined1  [16])0x0;
  }
  else {
    QVar125.m_data = (storage_type *)0x18;
    QVar125.m_size = (qsizetype)local_ff0;
    QString::fromUtf8(QVar125);
    pQVar5 = (QArrayData *)CONCAT44(local_ff0._4_4_,local_ff0._0_4_);
    uVar7 = local_fe8._0_8_;
    local_fd8._0_8_ = local_fe8._8_8_;
    pcVar9 = "false";
    if (iVar2 == 1) {
      pcVar9 = "true";
    }
    psVar10 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar10 + (long)(pcVar9 + 1);
      psVar10 = psVar10 + 1;
    } while (*pcVar1 != '\0');
    QVar126.m_data = psVar10;
    QVar126.m_size = (qsizetype)local_ff0;
    QString::fromUtf8(QVar126);
    local_fc8 = local_fe8;
    local_fd8._8_8_ = CONCAT44(local_ff0._4_4_,local_ff0._0_4_);
    local_ff0._0_4_ = tTagValue;
    local_fe8._8_8_ = uVar7;
    local_fe8._0_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_fd8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_fd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_fd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QArrayData *)local_fd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_fd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)local_fd8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_fd8._8_8_,2,0x10);
      }
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_ff0);
  if (*(long *)((long)__buf + 0x2d8) == 0) {
    local_1028._0_4_ = tNothing;
    stack0xffffffffffffefe0 = (undefined1  [16])0x0;
    local_1010 = (undefined1  [16])0x0;
    local_1000 = (undefined1  [16])0x0;
  }
  else {
    QVar127.m_data = (storage_type *)0x18;
    QVar127.m_size = (qsizetype)local_1028;
    QString::fromUtf8(QVar127);
    pQVar5 = (QArrayData *)CONCAT44(local_1028._4_4_,local_1028._0_4_);
    local_1010._0_8_ = pDStack_1018;
    local_1028._0_4_ = tTagValue;
    pDStack_1018 = (Data *)local_1028._8_8_;
    local_1028._8_8_ = pQVar5;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1010._8_8_ = *(undefined8 *)((long)__buf + 0x2c8);
    local_1000 = *(undefined1 (*) [16])((long)__buf + 0x2d0);
    if ((int *)local_1010._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1010._8_8_ = *(int *)local_1010._8_8_ + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,(xml_output *)local_1028);
  QVar128.m_data = (storage_type *)0x9;
  QVar128.m_size = (qsizetype)&local_1060;
  QString::fromUtf8(QVar128);
  local_1060.xo_text.d.size = (qsizetype)local_1060.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_1060._4_4_,local_1060.xo_type);
  local_1060.xo_type = tCloseTag;
  local_1060.xo_text.d.ptr = (char16_t *)local_1060.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1060.xo_value.d.d = (Data *)0x0;
  local_1060.xo_value.d.ptr = (char16_t *)0x0;
  local_1060.xo_value.d.size = 0;
  local_1060.xo_text.d.d = (Data *)pQVar5;
  XmlOutput::operator<<(pXVar8,&local_1060);
  if (&(local_1060.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1060.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1060.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1060.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1060.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1060.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if ((QArrayData *)local_1010._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1010._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1010._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1028._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1028._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1028._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_fd8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_fd8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_fd8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_fd8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_fd8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_fe8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_fe8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_fe8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_fe8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_fe8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_fa0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_fa0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_fa0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_fb0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_fb0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_fb0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_fb0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_fb0._0_8_,2,0x10);
    }
  }
  if (local_10a8 != (QArrayData *)0x0) {
    LOCK();
    (local_10a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10a8,2,0x10);
    }
  }
  if ((QArrayData *)local_f60._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f60._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f60._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_f70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f70._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f70._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_f28._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f28._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f28._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f28._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f28._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_f38._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f38._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f38._0_8_,2,0x10);
    }
  }
  if (&(local_f08.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_f08.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f08.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f08.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_eb8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_eb8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_eb8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_eb8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_eb8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_ec8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ec8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ec8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ec8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ec8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_e80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e80._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_e90._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e90._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e90._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_e48._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e48._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e48._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_e58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e58._0_8_,2,0x10);
    }
  }
  if (&(local_e28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_dd8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_dd8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_dd8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_dd8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_dd8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_de8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_de8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_de8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_de8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_de8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_da0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_da0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_da0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_db0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_db0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_db0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_db0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_db0._0_8_,2,0x10);
    }
  }
  if (local_1118 != (QArrayData *)0x0) {
    LOCK();
    (local_1118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1118,2,0x10);
    }
  }
  if ((QArrayData *)local_d60._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d60._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d60._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_d70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d70._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d70._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_d28._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d28._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d28._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d28._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d28._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_d38._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d38._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d38._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_cf0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_cf0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_cf0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_cf0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_cf0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_d00._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d00._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d00._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d00._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d00._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_cb8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_cb8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_cb8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_cb8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_cb8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_cc8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_cc8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_cc8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_cc8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_cc8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_c80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_c80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_c80._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_c90._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_c90._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_c90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_c90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_c90._0_8_,2,0x10);
    }
  }
  if (local_10b8 != (QArrayData *)0x0) {
    LOCK();
    (local_10b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10b8,2,0x10);
    }
  }
  if ((QArrayData *)local_c48._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c48._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c60._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c60._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c10._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c10._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c10._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_c28._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c28._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c28._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_bd8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_bd8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_bd8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_bd8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_bd8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_be8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_be8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_be8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_be8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_be8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_ba0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ba0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ba0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ba0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ba0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_bb0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_bb0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_bb0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_bb0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_bb0._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b68._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b68._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b80._8_8_,2,0x10);
    }
  }
  if (&(local_b28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_b48);
  if ((QArrayData *)local_ad8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ad8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ad8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ad8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ad8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_ae8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ae8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ae8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ae8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ae8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_aa0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_aa0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_aa0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_ab8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_ab8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_ab8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a68._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a68._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a68._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_a80._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a80._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a80._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_a30._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_a30._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_a30._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_a40._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_a40._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_a40._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_a40._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_a40._0_8_,2,0x10);
    }
  }
  if (local_10e0 != (QArrayData *)0x0) {
    LOCK();
    (local_10e0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10e0,2,0x10);
    }
  }
  if ((QArrayData *)auStack_9f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_9f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_9f0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_a00._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_a00._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_a00._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_a00._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_a00._0_8_,2,0x10);
    }
  }
  if (local_10b0 != (QArrayData *)0x0) {
    LOCK();
    (local_10b0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10b0,2,0x10);
    }
  }
  if ((QArrayData *)local_9b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_9b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_9b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_9b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_9b8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_9c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_9c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_9c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_9c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_9c8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_980._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_980._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_980._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_980._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_980._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_990._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_990._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_990._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_990._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_990._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_948._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_948._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_948._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_948._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_948._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_958._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_958._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_958._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_958._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_958._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_910._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_910._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_910._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_928._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_928._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_928._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8d8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8f0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8f0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8f0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8a0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8a0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8a0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_8b8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_8b8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_8b8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_868._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_868._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_868._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_868._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_868._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_878._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_878._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_878._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_878._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_878._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_830._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_830._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_830._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_830._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_830._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_840._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_840._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_840._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_840._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_840._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_7f8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_7f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_7f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_7f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_7f8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_808._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_808._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_808._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_808._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_808._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_7c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_7c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_7c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_7d0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_7d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_7d0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_7d0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_7d0._0_8_,2,0x10);
    }
  }
  if (local_10d8 != (QArrayData *)0x0) {
    LOCK();
    (local_10d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10d8,2,0x10);
    }
  }
  if ((QArrayData *)local_780._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_780._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_780._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_790._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_790._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_790._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_790._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_790._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_748._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_748._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_748._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_758._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_758._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_758._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_758._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_758._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_710._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_710._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_710._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_710._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_710._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_720._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_720._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_720._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_720._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_720._0_8_,2,0x10);
    }
  }
  if (&(local_6f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_668._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_668._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_668._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_668._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_668._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_678._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_678._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_678._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_678._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_678._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_630._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_630._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_630._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_640._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_640._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_640._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_640._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_640._0_8_,2,0x10);
    }
  }
  if (local_10d0 != (QArrayData *)0x0) {
    LOCK();
    (local_10d0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10d0,2,0x10);
    }
  }
  if ((QArrayData *)local_5f8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_5f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_5f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_5f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_5f8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_608._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_608._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_608._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_608._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_608._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_5c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_5c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_5c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_5d0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_5d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_5d0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_5d0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_5d0._0_8_,2,0x10);
    }
  }
  if (local_1100 != (QArrayData *)0x0) {
    LOCK();
    (local_1100->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1100,2,0x10);
    }
  }
  if ((QArrayData *)local_588._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_588._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_588._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_588._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_588._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_598._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_598._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_598._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_598._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_598._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_550._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_550._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_550._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_560._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_560._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_560._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_560._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_560._0_8_,2,0x10);
    }
  }
  if (local_10c8 != (QArrayData *)0x0) {
    LOCK();
    (local_10c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10c8,2,0x10);
    }
  }
  if ((QArrayData *)local_518._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_518._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_518._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_530._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_530._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_530._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4e0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4e0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4e0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4e0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4e0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4f0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4f0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4f0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4f0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4f0._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4a8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4a8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4a8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_4b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_4b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_4b8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_470._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_470._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_470._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_480._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_480._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_480._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_480._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_480._0_8_,2,0x10);
    }
  }
  if (local_10f8 != (QArrayData *)0x0) {
    LOCK();
    (local_10f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10f8,2,0x10);
    }
  }
  if (&(local_448.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_448.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_448.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_448.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_448.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_448.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_3f8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3f8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3f8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3f8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_3f8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_408._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_408._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_408._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_408._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_408._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_3c0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_3c0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_3c0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_3d0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_3d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_3d0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_3d0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_3d0._0_8_,2,0x10);
    }
  }
  if (local_10e8 != (QArrayData *)0x0) {
    LOCK();
    (local_10e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10e8,2,0x10);
    }
  }
  if ((QArrayData *)local_380._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_380._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_380._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_380._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_380._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_390._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_390._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_390._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_390._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_390._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_348._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_348._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_348._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_348._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_348._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_358._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_358._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_358._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_358._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_358._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_310._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_310._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_310._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_320._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_320._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_320._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_320._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_320._0_8_,2,0x10);
    }
  }
  if (local_10c0 != (QArrayData *)0x0) {
    LOCK();
    (local_10c0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10c0,2,0x10);
    }
  }
  if ((QArrayData *)auStack_2d0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_2d0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_2d0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_2e0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_2e0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_2e0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_2e0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_2e0._0_8_,2,0x10);
    }
  }
  if (local_10f0 != (QArrayData *)0x0) {
    LOCK();
    (local_10f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_10f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_10f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_10f0,2,0x10);
    }
  }
  if ((QArrayData *)auStack_290._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_290._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_290._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_2a0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_2a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_2a0._0_8_,2,0x10);
    }
  }
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  if ((QArrayData *)local_258._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_258._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_258._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_268._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_268._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_268._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_220._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_220._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_220._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_238._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_238._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_238._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1e8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1e8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1e8._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_1f8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_1f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_1f8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1b0._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1b0._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1b0._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_1c0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_1c0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_1c0._0_8_,2,0x10);
    }
  }
  if (pQVar13 != (QArrayData *)0x0) {
    LOCK();
    (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar13,2,0x10);
    }
  }
  if ((QArrayData *)auStack_170._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_170._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_170._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)auStack_180._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_180._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_180._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_180._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_180._0_8_,2,0x10);
    }
  }
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,2,0x10);
    }
  }
  if ((QArrayData *)local_138._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_138._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_138._8_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_150._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_150._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_150._8_8_,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_70._32_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._32_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._32_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_70._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._8_8_,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml
        << tag(_CLCompile)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories, ";")
            << attrTagS(_AssemblerListingLocation, tool.AssemblerListingLocation)
            << attrTagS(_AssemblerOutput, toString(tool.AssemblerOutput))
            << attrTagS(_BasicRuntimeChecks, toString(tool.BasicRuntimeChecks))
            << attrTagT(_BrowseInformation, toTriState(tool.BrowseInformation))
            << attrTagS(_BrowseInformationFile, tool.BrowseInformationFile)
            << attrTagT(_BufferSecurityCheck, tool.BufferSecurityCheck)
            << attrTagS(_CallingConvention, toString(tool.CallingConvention))
            << attrTagS(_CompileAs, toString(tool.CompileAs))
            << attrTagS(_CompileAsManaged, toString(tool.CompileAsManaged))
            << attrTagT(_CompileAsWinRT, tool.CompileAsWinRT)
            << attrTagT(_CreateHotpatchableImage, tool.CreateHotpatchableImage)
            << attrTagS(_DebugInformationFormat, toString(tool.DebugInformationFormat,
                                                          tool.config->CompilerVersion))
            << attrTagT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
            << attrTagX(_DisableSpecificWarnings, tool.DisableSpecificWarnings, ";")
            << attrTagS(_EnableEnhancedInstructionSet, toString(tool.EnableEnhancedInstructionSet))
            << attrTagT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
            << attrTagT(_EnablePREfast, tool.EnablePREfast)
            << attrTagS(_ErrorReporting, tool.ErrorReporting)
            << attrTagS(_ExceptionHandling, toString(tool.ExceptionHandling))
            << attrTagT(_ExpandAttributedSource, tool.ExpandAttributedSource)
            << attrTagS(_FavorSizeOrSpeed, toString(tool.FavorSizeOrSpeed))
            << attrTagT(_FloatingPointExceptions, tool.FloatingPointExceptions)
            << attrTagS(_FloatingPointModel, toString(tool.FloatingPointModel))
            << attrTagT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
            << attrTagX(_ForcedIncludeFiles, tool.ForcedIncludeFiles, ";")
            << attrTagX(_ForcedUsingFiles, tool.ForcedUsingFiles, ";")
            << attrTagT(_FunctionLevelLinking, tool.EnableFunctionLevelLinking)
            << attrTagT(_GenerateXMLDocumentationFiles, tool.GenerateXMLDocumentationFiles)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InlineFunctionExpansion, toString(tool.InlineFunctionExpansion))
            << attrTagT(_IntrinsicFunctions, tool.EnableIntrinsicFunctions)
            << attrTagT(_MinimalRebuild, tool.MinimalRebuild)
            << attrTagT(_MultiProcessorCompilation, tool.MultiProcessorCompilation)
            << attrTagS(_LanguageStandard, tool.LanguageStandard)
            << attrTagS(_LanguageStandard_C, tool.LanguageStandard_C)
            << attrTagS(_ObjectFileName, tool.ObjectFile)
            << attrTagT(_OmitDefaultLibName, tool.OmitDefaultLibName)
            << attrTagT(_OmitFramePointers, tool.OmitFramePointers)
            << attrTagT(_OpenMPSupport, tool.OpenMP)
            << attrTagS(_Optimization, toString(tool.Optimization))
            << attrTagS(_PrecompiledHeader, toString(tool.UsePrecompiledHeader))
            << attrTagS(_PrecompiledHeaderFile, tool.PrecompiledHeaderThrough)
            << attrTagS(_PrecompiledHeaderOutputFile, tool.PrecompiledHeaderFile)
            << attrTagT(_PreprocessKeepComments, tool.KeepComments)
            << attrTagX(_PreprocessorDefinitions, unquote(tool.PreprocessorDefinitions), ";")
            << attrTagS(_PreprocessOutputPath, tool.PreprocessOutputPath)
            << attrTagT(_PreprocessSuppressLineNumbers, tool.PreprocessSuppressLineNumbers)
            << attrTagT(_PreprocessToFile, toTriState(tool.GeneratePreprocessedFile))
            << fixedProgramDataBaseFileNameOutput(tool)
            << attrTagS(_ProcessorNumber, tool.MultiProcessorCompilationProcessorCount)
            << attrTagS(_RuntimeLibrary, toString(tool.RuntimeLibrary))
            << attrTagT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
            << attrTagT(_ShowIncludes, tool.ShowIncludes)
            << attrTagT(_SmallerTypeCheck, tool.SmallerTypeCheck)
            << attrTagT(_StringPooling, tool.StringPooling)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagX(_TreatSpecificWarningsAsErrors, tool.TreatSpecificWarningsAsErrors, ";")
            << attrTagT(_TreatWarningAsError, tool.WarnAsError)
            << attrTagT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
            << attrTagT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_UseFullPaths, tool.DisplayFullPaths)
            << attrTagT(_UseUnicodeForAssemblerListing, tool.UseUnicodeForAssemblerListing)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
            << attrTagT(_WholeProgramOptimization, tool.WholeProgramOptimization)
            << attrTagS(_XMLDocumentationFileName, tool.XMLDocumentationFileName)
        << closetag(_CLCompile);
}